

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O1

bool __thiscall ON_Linetype::ClearPattern(ON_Linetype *this)

{
  if ((this->m_is_locked_bits & 1) == 0) {
    this->m_is_set_bits = this->m_is_set_bits & 0xfe;
    ON_SimpleArray<ON_LinetypeSegment>::SetCapacity(&this->m_private->m_segments,0);
  }
  return (this->m_is_set_bits & 1) == 0;
}

Assistant:

bool ON_Linetype::ClearPattern()
{
  if (false == PatternIsLocked())
  {
    m_is_set_bits &= ~ON_Linetype::pattern_bit;
    m_private->m_segments.Destroy();
  }
  return (false == PatternIsSet());
}